

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryFindIndex(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *local_90;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  int64 length;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2197,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_68,pTVar4);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x219b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec42,L"Array.prototype.findIndex");
  }
  obj = (RecyclableObject *)0x0;
  local_90 = (RecyclableObject *)0x0;
  JsReentLock::unlock((JsReentLock *)local_68);
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  TryGetArrayAndLength<long>
            (pvVar6,(ScriptContext *)jsReentLock._24_8_,L"Array.prototype.findIndex",
             (JavascriptArray **)&obj,&local_90,(long *)&pArr);
  pvVar6 = FindHelper<true,false>
                     ((JavascriptArray *)obj,(TypedArrayBase *)0x0,local_90,(int64)pArr,
                      (Arguments *)&scriptContext,(ScriptContext *)jsReentLock._24_8_);
  JsReentLock::~JsReentLock((JsReentLock *)local_68);
  return pvVar6;
}

Assistant:

Var JavascriptArray::EntryFindIndex(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.findIndex"));
        }

        int64 length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT_UNLOCK(jsReentLock,
            TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.findIndex"), &pArr, &obj, &length));
            return JavascriptArray::FindHelper<true, false>(pArr, nullptr, obj, length, args, scriptContext);
    }